

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O3

void __thiscall p2t::Sweep::FillBasinReq(Sweep *this,SweepContext *tcx,Node *node)

{
  double *pdVar1;
  Node *pNVar2;
  Node *pNVar3;
  double dVar4;
  Node *pNVar5;
  Point *pPVar6;
  double dVar7;
  double dVar8;
  
  if ((tcx->basin).width <=
      *(double *)
       (**(long **)((long)&(tcx->basin).left_node + (ulong)(((tcx->basin).left_highest ^ 1) << 4)) +
       8) - node->point->y) {
    do {
      Fill(this,tcx,node);
      pNVar2 = node->next;
      pNVar5 = node->prev;
      pNVar3 = (tcx->basin).right_node;
      if (pNVar5 == (tcx->basin).left_node) {
        if (pNVar2 == pNVar3) {
          return;
        }
        pPVar6 = pNVar2->next->point;
        dVar8 = pPVar6->x;
        dVar4 = pPVar6->y;
        dVar7 = pNVar2->point->y;
        dVar8 = (dVar7 - dVar4) * (node->point->x - dVar8) -
                (pNVar2->point->x - dVar8) * (node->point->y - dVar4);
        pNVar5 = pNVar2;
        if ((1e-12 <= ABS(dVar8)) && (dVar8 <= 0.0)) {
          return;
        }
      }
      else if (pNVar2 == pNVar3) {
        pPVar6 = pNVar5->prev->point;
        dVar8 = pPVar6->x;
        dVar4 = pPVar6->y;
        dVar7 = pNVar5->point->y;
        dVar8 = (dVar7 - dVar4) * (node->point->x - dVar8) -
                (pNVar5->point->x - dVar8) * (node->point->y - dVar4);
        if ((1e-12 <= ABS(dVar8)) && (0.0 < dVar8)) {
          return;
        }
      }
      else {
        dVar7 = pNVar2->point->y;
        pdVar1 = &pNVar5->point->y;
        pPVar6 = pNVar5->point;
        if (dVar7 < *pdVar1 || dVar7 == *pdVar1) {
          pNVar5 = pNVar2;
          pPVar6 = pNVar2->point;
        }
        dVar7 = pPVar6->y;
      }
      node = pNVar5;
    } while ((tcx->basin).width <=
             *(double *)
              (**(long **)((long)&(tcx->basin).left_node +
                          (ulong)(((tcx->basin).left_highest ^ 1) << 4)) + 8) - dVar7);
  }
  return;
}

Assistant:

bool Sweep::IsShallow(SweepContext& tcx, Node& node)
{
  double height;

  if (tcx.basin.left_highest) {
    height = tcx.basin.left_node->point->y - node.point->y;
  } else {
    height = tcx.basin.right_node->point->y - node.point->y;
  }

  // if shallow stop filling
  if (tcx.basin.width > height) {
    return true;
  }
  return false;
}